

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaBackend.cpp
# Opt level: O2

void __thiscall xmrig::CudaBackend::CudaBackend(CudaBackend *this,Controller *controller)

{
  CudaBackendPrivate *this_00;
  
  (this->super_IBackend)._vptr_IBackend = (_func_int **)&PTR__CudaBackend_001bc3b0;
  this_00 = (CudaBackendPrivate *)operator_new(0x80);
  CudaBackendPrivate::CudaBackendPrivate(this_00,controller);
  this->d_ptr = this_00;
  Workers<xmrig::CudaLaunchData>::setBackend(&this_00->workers,&this->super_IBackend);
  return;
}

Assistant:

xmrig::CudaBackend::CudaBackend(Controller *controller) :
    d_ptr(new CudaBackendPrivate(controller))
{
    d_ptr->workers.setBackend(this);
}